

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.cpp
# Opt level: O2

int NULLCMemory::compare(NULLCArray lhs,int lhsOffset,NULLCArray rhs,int rhsOffset,int size)

{
  bool bVar1;
  int iVar2;
  NULLCArray buffer;
  NULLCArray buffer_00;
  
  buffer.ptr._4_4_ = (undefined4)((ulong)register0x00000030 >> 0x20);
  buffer.ptr._0_4_ = lhs.len;
  buffer.len = lhsOffset;
  iVar2 = rhsOffset;
  bVar1 = check_access((NULLCMemory *)lhs.ptr,buffer,0,size,rhsOffset);
  if (bVar1) {
    buffer_00.ptr = (char *)(ulong)rhs.len;
    buffer_00.len = rhsOffset;
    bVar1 = check_access((NULLCMemory *)rhs.ptr,buffer_00,0,size,iVar2);
    if (bVar1) {
      iVar2 = memcmp((NULLCMemory *)lhs.ptr + lhsOffset,(NULLCMemory *)rhs.ptr + rhsOffset,
                     (long)size);
      return iVar2;
    }
  }
  return 0;
}

Assistant:

int compare(NULLCArray lhs, int lhsOffset, NULLCArray rhs, int rhsOffset, int size)
	{
		if(!check_access(lhs, lhsOffset, 0, size))
			return 0;

		if(!check_access(rhs, rhsOffset, 0, size))
			return 0;

		return memcmp(lhs.ptr + lhsOffset, rhs.ptr + rhsOffset, size);
	}